

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeHMS(DateTime *p)

{
  int iVar1;
  int s;
  DateTime *p_local;
  
  if (p->validHMS == '\0') {
    computeJD(p);
    p->s = (double)(int)((p->iJD + 43200000) % 86400000) / 1000.0;
    iVar1 = (int)p->s;
    p->s = p->s - (double)iVar1;
    p->h = iVar1 / 0xe10;
    iVar1 = iVar1 + p->h * -0xe10;
    p->m = iVar1 / 0x3c;
    p->s = (double)(iVar1 + p->m * -0x3c) + p->s;
    p->rawS = '\0';
    p->validHMS = '\x01';
  }
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int s;
  if( p->validHMS ) return;
  computeJD(p);
  s = (int)((p->iJD + 43200000) % 86400000);
  p->s = s/1000.0;
  s = (int)p->s;
  p->s -= s;
  p->h = s/3600;
  s -= p->h*3600;
  p->m = s/60;
  p->s += s - p->m*60;
  p->rawS = 0;
  p->validHMS = 1;
}